

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O1

int __thiscall Confparse::ParseInt(Confparse *this,char *key,int defaultv)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  
  pcVar1 = Parse(this,key);
  iVar4 = defaultv;
  if (pcVar1 != (char *)0x0) {
    pcVar1 = Parse(this,key);
    lVar2 = strtol(pcVar1,(char **)0x0,10);
    piVar3 = __errno_location();
    iVar4 = (int)lVar2;
    if (*piVar3 == 0x22) {
      iVar4 = defaultv;
    }
  }
  return iVar4;
}

Assistant:

int Confparse::ParseInt(const char *key, int defaultv) {
	char *p = Parse(key);
	if (p) {
		int v = strtol((char *)Parse(key), NULL, 10);
		if (errno == ERANGE)
			return defaultv;
		else
			return v;
	} else
		return defaultv;
}